

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::MultiVertexArrayCountTests::init
          (MultiVertexArrayCountTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc_00;
  GLValue GVar2;
  GLValue GVar3;
  undefined1 local_120 [8];
  string desc;
  string name;
  undefined4 uStack_bc;
  undefined1 local_b0 [8];
  ArraySpec arraySpec;
  undefined1 local_68 [4];
  int arrayNdx;
  Spec spec;
  int arrayCountNdx;
  int arrayCounts [7];
  MultiVertexArrayCountTests *this_local;
  
  arrayCounts[0] = 4;
  arrayCounts[1] = 5;
  arrayCounts[2] = 6;
  arrayCounts[3] = 7;
  iVar1 = 8;
  arrayCounts[4] = 8;
  spec.arrays.
  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while (spec.arrays.
         super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 7) {
    deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_68);
    local_68 = (undefined1  [4])0x1;
    arrayNdx = 0x100;
    spec.primitive = PRIMITIVE_POINTS;
    for (arraySpec.max.field_1._4_4_ = 0;
        (int)arraySpec.max.field_1._4_4_ <
        arrayCounts
        [(long)spec.arrays.
               super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -2];
        arraySpec.max.field_1._4_4_ = arraySpec.max.field_1._4_4_ + 1) {
      GVar2 = deqp::gls::GLValue::getMinValue(INPUTTYPE_FLOAT);
      GVar3 = deqp::gls::GLValue::getMaxValue(INPUTTYPE_FLOAT);
      max_._4_4_ = name.field_2._12_4_;
      max_.type = GVar3.type;
      min_._4_4_ = uStack_bc;
      min_.type = GVar2.type;
      min_.field_1 = GVar2.field_1;
      max_.field_1 = GVar3.field_1;
      deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                ((ArraySpec *)local_b0,INPUTTYPE_FLOAT,OUTPUTTYPE_VEC2,STORAGE_USER,
                 USAGE_DYNAMIC_DRAW,2,0,0,false,min_,max_);
      std::
      vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                   *)&spec.first,(value_type *)local_b0);
    }
    getTestName_abi_cxx11_((string *)((long)&desc.field_2 + 8),this,(Spec *)local_68);
    getTestName_abi_cxx11_((string *)local_120,this,(Spec *)local_68);
    this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    renderCtx = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    name_00 = (char *)std::__cxx11::string::c_str();
    desc_00 = (char *)std::__cxx11::string::c_str();
    deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
              (this_00,testCtx,renderCtx,(Spec *)local_68,name_00,desc_00);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_68);
    iVar1 = spec.arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    spec.arrays.
    super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar1;
  }
  return iVar1;
}

Assistant:

void MultiVertexArrayCountTests::init (void)
{
	// Test attribute counts
	int arrayCounts[] = {2, 3, 4, 5, 6, 7, 8};

	for (int arrayCountNdx = 0; arrayCountNdx < DE_LENGTH_OF_ARRAY(arrayCounts); arrayCountNdx++)
	{
		MultiVertexArrayTest::Spec spec;

		spec.primitive	= Array::PRIMITIVE_TRIANGLES;
		spec.drawCount	= 256;
		spec.first		= 0;

		for (int arrayNdx = 0; arrayNdx < arrayCounts[arrayCountNdx]; arrayNdx++)
		{
			MultiVertexArrayTest::Spec::ArraySpec arraySpec(Array::INPUTTYPE_FLOAT,
															Array::OUTPUTTYPE_VEC2,
															Array::STORAGE_USER,
															Array::USAGE_DYNAMIC_DRAW,
															2,
															0,
															0,
															false,
															GLValue::getMinValue(Array::INPUTTYPE_FLOAT),
															GLValue::getMaxValue(Array::INPUTTYPE_FLOAT));

			spec.arrays.push_back(arraySpec);
		}

		std::string name = getTestName(spec);
		std::string desc = getTestName(spec);

		addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), desc.c_str()));
	}
}